

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O2

bool __thiscall
Assimp::DefaultLogger::detatchStream(DefaultLogger *this,LogStream *pStream,uint severity)

{
  LogStreamInfo *pLVar1;
  uint uVar2;
  const_iterator __position;
  
  if (pStream != (LogStream *)0x0) {
    uVar2 = ~severity;
    for (__position._M_current =
              (this->m_StreamArray).
              super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
        __position._M_current !=
        (this->m_StreamArray).
        super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; __position._M_current = __position._M_current + 1
        ) {
      pLVar1 = *__position._M_current;
      if (pLVar1->m_pStream == pStream) {
        if (severity == 0) {
          uVar2 = 0xfffffff0;
        }
        pLVar1->m_uiErrorSeverity = pLVar1->m_uiErrorSeverity & uVar2;
        if ((*__position._M_current)->m_uiErrorSeverity != 0) {
          return true;
        }
        (*__position._M_current)->m_pStream = (LogStream *)0x0;
        pLVar1 = *__position._M_current;
        if ((pLVar1 != (LogStreamInfo *)0x0) && (pLVar1->m_pStream != (LogStream *)0x0)) {
          (*pLVar1->m_pStream->_vptr_LogStream[1])();
        }
        operator_delete(pLVar1);
        std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::erase
                  (&this->m_StreamArray,__position);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool DefaultLogger::detatchStream( LogStream *pStream, unsigned int severity ) {
    if ( nullptr == pStream ) {
        return false;
    }

    if (0 == severity)  {
        severity = SeverityAll;
    }

    bool res( false );
    for ( StreamIt it = m_StreamArray.begin(); it != m_StreamArray.end(); ++it ) {
        if ( (*it)->m_pStream == pStream ) {
            (*it)->m_uiErrorSeverity &= ~severity;
            if ( (*it)->m_uiErrorSeverity == 0 ) {
                // don't delete the underlying stream 'cause the caller gains ownership again
                (**it).m_pStream = nullptr;
                delete *it;
                m_StreamArray.erase( it );
                res = true;
                break;
            }
            return true;
        }
    }
    return res;
}